

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConstraintPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintPrototypeSyntax,slang::syntax::ConstraintPrototypeSyntax_const&>
          (BumpAllocator *this,ConstraintPrototypeSyntax *args)

{
  ConstraintPrototypeSyntax *this_00;
  
  this_00 = (ConstraintPrototypeSyntax *)allocate(this,0xe8,8);
  slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }